

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
* ParseSelfCGroup_abi_cxx11_(void)

{
  char cVar1;
  bool bVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
  *in_RDI;
  long lVar3;
  ulong uVar4;
  string line;
  CGroupSubSys subsys;
  ifstream cgroup;
  string local_2f8;
  CGroupSubSys local_2d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>
  local_298;
  long local_238 [4];
  byte abStack_218 [488];
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  std::ifstream::ifstream(local_238,"/proc/self/cgroup",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_local_buf[0] = '\0';
    lVar3 = *(long *)(local_238[0] + -0x18);
    if ((abStack_218[lVar3] & 2) == 0) {
      do {
        cVar1 = std::ios::widen((char)&local_2f8 + (char)lVar3 + -0x40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_2f8,cVar1);
        local_2d8.name._M_string_length = 0;
        local_2d8.name.field_2._M_local_buf[0] = '\0';
        local_2d8.subsystems.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2d8.subsystems.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2d8.subsystems.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2d8.name._M_dataplus._M_p = (pointer)&local_2d8.name.field_2;
        bVar2 = CGroupSubSys::parse(&local_2d8,&local_2f8);
        if ((bVar2) &&
           (local_2d8.subsystems.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_2d8.subsystems.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
          lVar3 = 0;
          uVar4 = 0;
          do {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_CGroupSubSys_&,_true>
                      (&local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((local_2d8.subsystems.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar3),&local_2d8);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,CGroupSubSys>>(in_RDI,&local_298);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_298.second.subsystems);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298.second.name._M_dataplus._M_p != &local_298.second.name.field_2) {
              operator_delete(local_298.second.name._M_dataplus._M_p,
                              local_298.second.name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298.first._M_dataplus._M_p != &local_298.first.field_2) {
              operator_delete(local_298.first._M_dataplus._M_p,
                              local_298.first.field_2._M_allocated_capacity + 1);
            }
            uVar4 = uVar4 + 1;
            lVar3 = lVar3 + 0x20;
          } while (uVar4 < (ulong)((long)local_2d8.subsystems.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2d8.subsystems.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2d8.subsystems);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8.name._M_dataplus._M_p != &local_2d8.name.field_2) {
          operator_delete(local_2d8.name._M_dataplus._M_p,
                          CONCAT71(local_2d8.name.field_2._M_allocated_capacity._1_7_,
                                   local_2d8.name.field_2._M_local_buf[0]) + 1);
        }
        lVar3 = *(long *)(local_238[0] + -0x18);
      } while ((abStack_218[lVar3] & 2) == 0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                               local_2f8.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
          *)in_RDI;
}

Assistant:

map<string, CGroupSubSys> ParseSelfCGroup() {
  map<string, CGroupSubSys> cgroups;
  ifstream cgroup("/proc/self/cgroup");
  if (!cgroup.is_open())
    return cgroups;
  string line;
  while (!cgroup.eof()) {
    getline(cgroup, line);
    CGroupSubSys subsys;
    if (!subsys.parse(line))
      continue;
    for (size_t i = 0; i < subsys.subsystems.size(); i++) {
      cgroups.insert(make_pair(subsys.subsystems[i], subsys));
    }
  }
  return cgroups;
}